

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void flatbuffers::AppendShortOption(stringstream *ss,FlatCOption *option)

{
  ostream *poVar1;
  
  if ((option->short_opt)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)(ss + 0x10),"-");
    std::operator<<(poVar1,(string *)option);
    if ((option->long_opt)._M_string_length != 0) {
      std::operator<<((ostream *)(ss + 0x10),"|");
    }
  }
  if ((option->long_opt)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)(ss + 0x10),"--");
    std::operator<<(poVar1,(string *)&option->long_opt);
    return;
  }
  return;
}

Assistant:

static void AppendShortOption(std::stringstream &ss,
                              const FlatCOption &option) {
  if (!option.short_opt.empty()) {
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) { ss << "|"; }
  }
  if (!option.long_opt.empty()) { ss << "--" << option.long_opt; }
}